

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

Tim_Man_t * Gia_ManGenerateTim(int nPis,int nPos,int nBoxes,int nIns,int nOuts)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *vDelayTables;
  void **ppvVar3;
  float *pfVar4;
  Tim_Man_t *p;
  int iVar5;
  
  vDelayTables = (Vec_Ptr_t *)malloc(0x10);
  vDelayTables->nCap = 8;
  vDelayTables->nSize = 0;
  ppvVar3 = (void **)malloc(0x40);
  vDelayTables->pArray = ppvVar3;
  pfVar4 = Gia_ManGenerateDelayTableFloat(nIns,nOuts);
  uVar1 = vDelayTables->nCap;
  if (vDelayTables->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vDelayTables->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vDelayTables->pArray,0x80);
      }
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_005da97e;
      if (vDelayTables->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vDelayTables->pArray,(ulong)uVar1 << 4);
      }
    }
    vDelayTables->pArray = ppvVar3;
    vDelayTables->nCap = iVar5;
  }
LAB_005da97e:
  iVar5 = vDelayTables->nSize;
  vDelayTables->nSize = iVar5 + 1;
  vDelayTables->pArray[iVar5] = pfVar4;
  p = Tim_ManStart(nOuts * nBoxes + nPis,nIns * nBoxes + nPos);
  Tim_ManSetDelayTables(p,vDelayTables);
  iVar5 = 0;
  if (0 < nBoxes) {
    do {
      Tim_ManCreateBox(p,iVar5,nIns,nPis,nOuts,0,0);
      nPis = nPis + nOuts;
      iVar5 = iVar5 + nIns;
      nBoxes = nBoxes + -1;
    } while (nBoxes != 0);
  }
  iVar2 = Tim_ManCiNum(p);
  if (nPis == iVar2) {
    iVar2 = Tim_ManCoNum(p);
    if (iVar5 + nPos == iVar2) {
      return p;
    }
    __assert_fail("curPo == Tim_ManCoNum(pMan)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                  ,0x285,"Tim_Man_t *Gia_ManGenerateTim(int, int, int, int, int)");
  }
  __assert_fail("curPi == Tim_ManCiNum(pMan)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                ,0x284,"Tim_Man_t *Gia_ManGenerateTim(int, int, int, int, int)");
}

Assistant:

Tim_Man_t * Gia_ManGenerateTim( int nPis, int nPos, int nBoxes, int nIns, int nOuts )
{
    Tim_Man_t * pMan;
    int i, curPi, curPo;
    Vec_Ptr_t * vDelayTables = Vec_PtrAlloc( 1 );
    Vec_PtrPush( vDelayTables, Gia_ManGenerateDelayTableFloat(nIns, nOuts) );
    pMan = Tim_ManStart( nPis + nOuts * nBoxes, nPos + nIns * nBoxes );
    Tim_ManSetDelayTables( pMan, vDelayTables );
    curPi = nPis;
    curPo = 0;
    for ( i = 0; i < nBoxes; i++ )
    {
        Tim_ManCreateBox( pMan, curPo, nIns, curPi, nOuts, 0, 0 );
        curPi += nOuts;
        curPo += nIns;
    }
    curPo += nPos;
    assert( curPi == Tim_ManCiNum(pMan) );
    assert( curPo == Tim_ManCoNum(pMan) );
    //Tim_ManPrint( pMan );
    return pMan;
}